

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

bool __thiscall CConsole::ArgStringIsValid(CConsole *this,char *pFormat)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  char Command;
  byte local_29;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = *pFormat;
  local_28 = pFormat;
  if (local_29 == 0) {
    bVar1 = true;
  }
  else {
    bVar2 = false;
    do {
      if ((bVar2) && (*local_28 != '\0')) {
LAB_001b8f0f:
        bVar1 = false;
        goto LAB_001b8f11;
      }
      bVar1 = false;
      if (local_29 < 0x69) {
        if (local_29 == 0x3f) {
          if (local_28[1] == '\0') goto LAB_001b8f0f;
        }
        else {
          bVar1 = false;
          if (local_29 != 0x66) goto LAB_001b8f11;
        }
      }
      else if (local_29 != 0x69) {
        if (local_29 == 0x72) {
          bVar2 = true;
        }
        else if (local_29 != 0x73) goto LAB_001b8f11;
      }
      bVar1 = NextParam(this,(char *)&local_29,&local_28);
    } while ((!bVar1) && (local_29 != 0));
    bVar1 = !bVar1;
  }
LAB_001b8f11:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool CConsole::ArgStringIsValid(const char *pFormat)
{
	char Command = *pFormat;
	bool Valid = true;
	bool Last = false;

	while(Valid)
	{
		if(!Command)
			break;

		if(Last && *pFormat)
			return false;

		if(Command == '?')
		{
			if(!pFormat[1])
				return false;
		}
		else
		{
			if(Command == 'i' || Command == 'f' || Command == 's')
				;
			else if(Command == 'r')
				Last = true;
			else
				return false;
		}

		Valid = !NextParam(&Command, pFormat);
	}

	return Valid;
}